

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMan.c
# Opt level: O3

void Abc_NodeCovDropData(Cov_Man_t *p,Abc_Obj_t *pObj)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  void *__ptr;
  void *__ptr_00;
  long lVar3;
  Min_Man_t *pMVar4;
  long *plVar5;
  uint uVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long *pEntry;
  
  pVVar2 = p->vFanCounts;
  if (pVVar2 == (Vec_Int_t *)0x0) {
    __assert_fail("p->vFanCounts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covMan.c"
                  ,0x81,"void Abc_NodeCovDropData(Cov_Man_t *, Abc_Obj_t *)");
  }
  iVar1 = pObj->Id;
  lVar7 = (long)iVar1;
  if ((lVar7 < 0) || (pVVar2->nSize <= iVar1)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                  ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  iVar9 = pVVar2->pArray[lVar7];
  if (iVar9 < 1) {
    __assert_fail("nFanouts > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/cov/covMan.c"
                  ,0x83,"void Abc_NodeCovDropData(Cov_Man_t *, Abc_Obj_t *)");
  }
  iVar9 = iVar9 + -1;
  if (iVar9 != 0) {
    pVVar2->pArray[lVar7] = iVar9;
    return;
  }
  lVar8 = *(long *)((long)pObj->pNtk->pManCut + 0x18);
  if (iVar1 < *(int *)(lVar8 + 4)) {
    __ptr = *(void **)(*(long *)(*(long *)(lVar8 + 8) + lVar7 * 8) + 0x18);
    __ptr_00 = *(void **)((long)__ptr + 8);
    if (__ptr_00 != (void *)0x0) {
      free(__ptr_00);
    }
    free(__ptr);
    uVar6 = pObj->Id;
    lVar7 = (long)(int)uVar6;
    if ((-1 < lVar7) &&
       (lVar8 = *(long *)((long)pObj->pNtk->pManCut + 0x18), (int)uVar6 < *(int *)(lVar8 + 4))) {
      lVar3 = *(long *)(lVar8 + 8);
      *(undefined8 *)(*(long *)(lVar3 + lVar7 * 8) + 0x18) = 0;
      pEntry = *(long **)(*(long *)(lVar3 + lVar7 * 8) + 0x10);
      if (pEntry != (long *)0x0) {
        pMVar4 = p->pManMin;
        do {
          plVar5 = (long *)*pEntry;
          Extra_MmFixedEntryRecycle(pMVar4->pMemMan,(char *)pEntry);
          pEntry = plVar5;
        } while (plVar5 != (long *)0x0);
        uVar6 = pObj->Id;
        if ((int)uVar6 < 0) goto LAB_00451aaa;
        lVar8 = *(long *)((long)pObj->pNtk->pManCut + 0x18);
      }
      if ((int)uVar6 < *(int *)(lVar8 + 4)) {
        *(undefined8 *)(*(long *)(*(long *)(lVar8 + 8) + (ulong)uVar6 * 8) + 0x10) = 0;
        p->nSupps = p->nSupps + -1;
        if ((int)uVar6 < p->vFanCounts->nSize) {
          p->vFanCounts->pArray[uVar6] = 0;
          return;
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
    }
  }
LAB_00451aaa:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Abc_NodeCovDropData( Cov_Man_t * p, Abc_Obj_t * pObj )
{
    int nFanouts;
    assert( p->vFanCounts );
    nFanouts = Vec_IntEntry( p->vFanCounts, pObj->Id );
    assert( nFanouts > 0 );
    if ( --nFanouts == 0 )
    {
        Vec_IntFree( Abc_ObjGetSupp(pObj) );
        Abc_ObjSetSupp( pObj, NULL );
        Min_CoverRecycle( p->pManMin, Abc_ObjGetCover2(pObj) );
        Abc_ObjSetCover2( pObj, NULL );
        p->nSupps--;
    }
    Vec_IntWriteEntry( p->vFanCounts, pObj->Id, nFanouts );
}